

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O0

void Imf_2_5::Attribute::registerAttributeType(char *typeName,_func_Attribute_ptr *newAttribute)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this;
  char *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>,_bool> pVar3
  ;
  stringstream _iex_throw_s;
  Lock lock;
  LockedTypeMap *tMap;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  undefined8 in_stack_fffffffffffffde0;
  undefined1 autoLock;
  Mutex *in_stack_fffffffffffffde8;
  LockedTypeMap *__x;
  Lock *in_stack_fffffffffffffdf0;
  pair<const_char_*const,_Imf_2_5::Attribute_*(*)()> local_1e0;
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  _Self local_48 [3];
  _Self local_30 [3];
  LockedTypeMap *local_18;
  _func_Attribute_ptr *local_10;
  char *local_8;
  
  autoLock = (undefined1)((ulong)in_stack_fffffffffffffde0 >> 0x38);
  local_8 = in_RDI;
  local_18 = anon_unknown_0::typeMap();
  IlmThread_2_5::Lock::Lock(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(bool)autoLock);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
       ::find((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
               *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),(key_type *)0x118e37)
  ;
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
       ::end((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
              *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  bVar1 = std::operator!=(local_30,local_48);
  if (!bVar1) {
    __x = local_18;
    std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>::
    pair<const_char_*&,_Imf_2_5::Attribute_*(*&)(),_true>(&local_1e0,&local_8,&local_10);
    pVar3 = std::
            map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
            ::insert((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                      *)in_stack_fffffffffffffdf0,(value_type *)__x);
    IlmThread_2_5::Lock::~Lock((Lock *)pVar3.first._M_node._M_node);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar2 = std::operator<<(local_1c0,"Cannot register image file attribute type \"");
  poVar2 = std::operator<<(poVar2,local_8);
  std::operator<<(poVar2,"\". The type has already been registered.");
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,local_1d0);
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
Attribute::registerAttributeType (const char typeName[],
			          Attribute *(*newAttribute)())
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    if (tMap.find (typeName) != tMap.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot register image file attribute "
			    "type \"" << typeName << "\". "
			    "The type has already been registered.");

    tMap.insert (TypeMap::value_type (typeName, newAttribute));
}